

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

int mspace_track_large_chunks(mspace msp,int enable)

{
  uint uVar1;
  
  uVar1 = *(uint *)((long)msp + 0x370);
  *(uint *)((long)msp + 0x370) = (uint)(enable == 0) | uVar1 & 0xfffffffe;
  return ~uVar1 & 1;
}

Assistant:

int mspace_track_large_chunks(mspace msp, int enable) {
  int ret = 0;
  mstate ms = (mstate)msp;
  if (!PREACTION(ms)) {
    if (!use_mmap(ms)) {
      ret = 1;
    }
    if (!enable) {
      enable_mmap(ms);
    } else {
      disable_mmap(ms);
    }
    POSTACTION(ms);
  }
  return ret;
}